

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::processEventsImpl(ClipboardImpl *this)

{
  bool bVar1;
  int iVar2;
  reference __src;
  undefined1 local_d0 [8];
  XEvent event;
  ClipboardImpl *this_local;
  
  event.pad[0x17] = (long)this;
  while (iVar2 = XCheckIfEvent(this->m_display,local_d0,anon_unknown.dwarf_8dd30::checkEvent,
                               this->m_window), iVar2 != 0) {
    std::deque<_XEvent,_std::allocator<_XEvent>_>::push_back(&this->m_events,(value_type *)local_d0)
    ;
  }
  while (bVar1 = std::deque<_XEvent,_std::allocator<_XEvent>_>::empty(&this->m_events),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __src = std::deque<_XEvent,_std::allocator<_XEvent>_>::front(&this->m_events);
    memcpy(local_d0,__src,0xc0);
    std::deque<_XEvent,_std::allocator<_XEvent>_>::pop_front(&this->m_events);
    processEvent(this,(XEvent *)local_d0);
  }
  return;
}

Assistant:

void ClipboardImpl::processEventsImpl()
{
    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
        m_events.push_back(event);

    // Handle the events for this window that we just picked out
    while (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop_front();
        processEvent(event);
    }
}